

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
::recover_slot(table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
               *this,uchar *pc)

{
  bool bVar1;
  
  bVar1 = group15<boost::unordered::detail::foa::plain_integral>::maybe_caused_overflow(pc);
  *pc = '\0';
  (this->size_ctrl).ml = (this->size_ctrl).ml - (ulong)bVar1;
  (this->size_ctrl).size = (this->size_ctrl).size - 1;
  return;
}

Assistant:

void recover_slot(unsigned char* pc) {
        /* If this slot potentially caused overflow, we decrease the maximum load
         * so that average probe length won't increase unboundedly in repeated
         * insert/erase cycles (drift).
         */
        size_ctrl.ml -= group_type::maybe_caused_overflow(pc);
        group_type::reset(pc);
        --size_ctrl.size;
    }